

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O0

textblock * object_info_out(object *obj,wchar_t mode)

{
  bool bVar1;
  _Bool _Var2;
  textblock *tb_00;
  bool terse_00;
  bool subjective_00;
  bool ego_00;
  textblock *tb;
  element_info local_98;
  _Bool ego;
  _Bool subjective;
  _Bool terse;
  _Bool something;
  element_info el_info [28];
  bitflag flags [6];
  wchar_t mode_local;
  object *obj_local;
  
  bVar1 = false;
  terse_00 = (mode & 1U) != 0;
  subjective_00 = (mode & 2U) != 0;
  ego_00 = (mode & 4U) != 0;
  tb_00 = textblock_new();
  if (obj->known != (object *)0x0) {
    if (obj->kind == obj->known->kind) {
      get_known_flags(obj,mode,&el_info[0x1b].flags);
      get_known_elements(obj,mode,&local_98);
      if (subjective_00) {
        describe_origin(tb_00,obj,terse_00);
      }
      if (!terse_00) {
        describe_flavor_text(tb_00,obj,ego_00);
      }
      _Var2 = object_fully_known(obj);
      if (((!_Var2) && ((obj->known->notice & 2) != 0)) && (_Var2 = tval_is_useable(obj), !_Var2)) {
        textblock_append(tb_00,"You do not know the full extent of this item\'s powers.\n");
        bVar1 = true;
      }
      _Var2 = describe_set(tb_00,obj);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_curses(tb_00,obj,&el_info[0x1b].flags);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_stats(tb_00,obj,mode);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_slays(tb_00,obj);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_brands(tb_00,obj);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_elements(tb_00,&local_98);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_protects(tb_00,&el_info[0x1b].flags);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_ignores(tb_00,&local_98);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_hates(tb_00,&local_98);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_sustains(tb_00,&el_info[0x1b].flags);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_misc_magic(tb_00,&el_info[0x1b].flags);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_light(tb_00,obj,mode);
      if (_Var2) {
        bVar1 = true;
      }
      _Var2 = describe_book(tb_00,obj,mode);
      if (_Var2) {
        bVar1 = true;
      }
      if ((ego_00) && (_Var2 = describe_ego(tb_00,obj->ego), _Var2)) {
        bVar1 = true;
      }
      if (bVar1) {
        textblock_append(tb_00,"\n");
      }
      if (!ego_00) {
        _Var2 = describe_effect(tb_00,obj,terse_00,subjective_00);
        if (_Var2) {
          bVar1 = true;
          textblock_append(tb_00,"\n");
        }
        if ((subjective_00) && (_Var2 = describe_combat(tb_00,obj), _Var2)) {
          bVar1 = true;
          textblock_append(tb_00,"\n");
        }
        if (((!terse_00) && (subjective_00)) && (_Var2 = describe_digger(tb_00,obj), _Var2)) {
          bVar1 = true;
        }
      }
      if (!terse_00) {
        if (bVar1) {
          textblock_append(tb_00,"\n%s\n",kb_info[obj->tval].text);
        }
        else {
          textblock_append(tb_00,"\n\nThis item does not seem to possess any special abilities.");
        }
      }
    }
    else {
      textblock_append(tb_00,"\n\nYou do not know what this is.\n");
    }
    return tb_00;
  }
  __assert_fail("obj->known",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-info.c"
                ,0x7c1,"textblock *object_info_out(const struct object *, int)");
}

Assistant:

static textblock *object_info_out(const struct object *obj, int mode)
{
	bitflag flags[OF_SIZE];
	struct element_info el_info[ELEM_MAX];
	bool something = false;

	bool terse = mode & OINFO_TERSE ? true : false;
	bool subjective = mode & OINFO_SUBJ ? true : false;
	bool ego = mode & OINFO_EGO ? true : false;
	textblock *tb = textblock_new();

	assert(obj->known);

	/* Unaware objects get simple descriptions */
	if (obj->kind != obj->known->kind) {
		textblock_append(tb, "\n\nYou do not know what this is.\n");
		return tb;
	}

	/* Grab the object flags */
	get_known_flags(obj, mode, flags);

	/* Grab the element info */
	get_known_elements(obj, mode, el_info);

	if (subjective) describe_origin(tb, obj, terse);
	if (!terse) describe_flavor_text(tb, obj, ego);

	if (!object_fully_known(obj) &&	(obj->known->notice & OBJ_NOTICE_ASSESSED) && !tval_is_useable(obj)) {
		textblock_append(tb, "You do not know the full extent of this item's powers.\n");
		something = true;
	}

	if (describe_set(tb, obj)) something = true;
	if (describe_curses(tb, obj, flags)) something = true;
	if (describe_stats(tb, obj, mode)) something = true;
	if (describe_slays(tb, obj)) something = true;
	if (describe_brands(tb, obj)) something = true;
	if (describe_elements(tb, el_info)) something = true;
	if (describe_protects(tb, flags)) something = true;
	if (describe_ignores(tb, el_info)) something = true;
	if (describe_hates(tb, el_info)) something = true;
	if (describe_sustains(tb, flags)) something = true;
	if (describe_misc_magic(tb, flags)) something = true;
	if (describe_light(tb, obj, mode)) something = true;
	if (describe_book(tb, obj, mode)) something = true;
	if (ego && describe_ego(tb, obj->ego)) something = true;
	if (something) textblock_append(tb, "\n");

	/* Skip all the very specific information where we are giving general
	   ego knowledge rather than for a single item - abilities can vary */
	if (!ego) {
		if (describe_effect(tb, obj, terse, subjective)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (subjective && describe_combat(tb, obj)) {
			something = true;
			textblock_append(tb, "\n");
		}

		if (!terse && subjective && describe_digger(tb, obj)) something = true;
	}

	/* Don't append anything in terse (for chararacter dump) */
	if (!terse) {
		if (!something) {
			textblock_append(tb, "\n\nThis item does not seem to possess any special abilities.");
		} else {
			textblock_append(tb, "\n%s\n", kb_info[obj->tval].text);
		}
	}

	return tb;
}